

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O0

string * __thiscall InputGraph::vertex_name_abi_cxx11_(InputGraph *this,int v)

{
  type_conflict2 tVar1;
  undefined4 in_EDX;
  iterator_facade<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::forward_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long>
  *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  int in_stack_0000000c;
  iterator it;
  unordered_associative_container_adaptor<_ddf44b9e_> *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  string *__str;
  
  __str = in_RDI;
  std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
            ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x111e8e);
  boost::bimaps::container_adaptor::associative_container_adaptor<$73302351$>::find<int>
            ((associative_container_adaptor<_73302351_> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8)
             ,in_stack_ffffffffffffffe0);
  std::unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>::operator->
            ((unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> *)0x111eb5);
  boost::bimaps::container_adaptor::unordered_associative_container_adaptor<$ddf44b9e$>::end
            (in_stack_ffffffffffffffb8);
  tVar1 = boost::iterators::operator==
                    (in_RSI,(iterator_facade<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::forward_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long>
                             *)in_RDI);
  if (tVar1) {
    std::__cxx11::to_string(in_stack_0000000c);
  }
  else {
    boost::iterators::detail::
    iterator_facade_base<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::forward_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long,_false,_false>
    ::operator->((iterator_facade_base<boost::bimaps::detail::map_view_iterator<boost::bimaps::relation::member_at::left,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>_>,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>,_boost::iterators::forward_traversal_tag,_boost::bimaps::relation::structured_pair<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_boost::bimaps::relation::normal_layout>_&,_long,_false,_false>
                  *)0x111efc);
    std::__cxx11::string::string(unaff_retaddr,__str);
  }
  return in_RDI;
}

Assistant:

auto InputGraph::vertex_name(int v) const -> string
{
    auto it = _imp->vertex_names.left.find(v);
    if (it == _imp->vertex_names.left.end())
        return to_string(v);
    else
        return it->second;
}